

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O0

_Bool ZBufferTestAndUpdate(ZBuffer *zbuffer,uint16_t x,uint16_t y,Real depth)

{
  undefined1 depth_00 [16];
  longdouble in_ST0;
  undefined6 in_stack_ffffffffffffff92;
  Real currentDepth;
  uint16_t imageHeight;
  uint16_t imageWidth;
  Real depth_local;
  uint16_t y_local;
  uint16_t x_local;
  ZBuffer *zbuffer_local;
  
  if ((x < zbuffer->imageWidth) && (y < zbuffer->imageHeight)) {
    ZBufferGetDepth((Real *)zbuffer,(ZBuffer *)(ulong)x,y,y);
    if (depth._0_10_ <= in_ST0) {
      depth_00._10_6_ = in_stack_ffffffffffffff92;
      depth_00._0_10_ = depth._0_10_;
      zbuffer_local._7_1_ = ZBufferSetDepth(zbuffer,x,y,(Real)depth_00);
    }
    else {
      fprintf(_stderr,"%s: Deeper than current depth (%d, %d) = %Lf < %Lf\n","ZBufferTestAndUpdate",
              (ulong)x,(ulong)y);
      zbuffer_local._7_1_ = false;
    }
  }
  else {
    fprintf(_stderr,"%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n","ZBufferTestAndUpdate",(ulong)x
            ,(ulong)zbuffer->imageWidth,(ulong)y,(uint)zbuffer->imageHeight);
    zbuffer_local._7_1_ = false;
  }
  return zbuffer_local._7_1_;
}

Assistant:

bool ZBufferTestAndUpdate(ZBuffer *zbuffer, uint16_t x, uint16_t y, Real depth) {
  const uint16_t imageWidth = zbuffer->imageWidth;
  const uint16_t imageHeight = zbuffer->imageHeight;
  if (imageWidth <= x || imageHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, imageWidth, y, imageHeight);
#endif
    return false;
  }
  Real currentDepth = ZBufferGetDepth(zbuffer, x, y);
  if (currentDepth < depth) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Deeper than current depth (%d, %d) = %Lf < %Lf\n", __FUNCTION_NAME__, x, y, currentDepth, depth);
#endif
    return false;
  }
  return ZBufferSetDepth(zbuffer, x, y, depth);
}